

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O1

string * __thiscall
flatbuffers::Namer::File(string *__return_storage_ptr__,Namer *this,string *filename,SkipFile skips)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  string local_48;
  
  ConvertCase(&local_48,filename,(this->config_).filenames,kUpperCamel);
  local_88[0] = local_78;
  if ((skips & Suffix) == None) {
    pcVar1 = (this->config_).filename_suffix._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar1,pcVar1 + (this->config_).filename_suffix._M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  }
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_88[0]);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_58 = *plVar4;
    uStack_50 = (undefined4)plVar3[3];
    uStack_4c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_a8[0] = local_98;
  if ((skips & Extension) == None) {
    pcVar1 = (this->config_).filename_extension._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,pcVar1,
               pcVar1 + (this->config_).filename_extension._M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  }
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_a8[0]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string File(const std::string &filename,
                           SkipFile skips = SkipFile::None) const {
    const bool skip_suffix = (skips & SkipFile::Suffix) != SkipFile::None;
    const bool skip_ext = (skips & SkipFile::Extension) != SkipFile::None;
    return ConvertCase(filename, config_.filenames, Case::kUpperCamel) +
           (skip_suffix ? "" : config_.filename_suffix) +
           (skip_ext ? "" : config_.filename_extension);
  }